

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O2

int definemacro(int f,int n)

{
  line *plVar1;
  line *plVar2;
  int iVar3;
  
  macrocount = 0;
  if (macrodef == 0) {
    if (maclhead != (line *)0x0) {
      plVar2 = maclhead->l_fp;
      while (plVar2 != maclhead) {
        plVar1 = plVar2->l_fp;
        free(plVar2);
        plVar2 = plVar1;
      }
      free(plVar2);
    }
    iVar3 = 0;
    plVar2 = lalloc(0);
    maclhead = plVar2;
    if (plVar2 != (line *)0x0) {
      ewprintf("Defining Keyboard Macro...");
      plVar2->l_bp = plVar2;
      plVar2->l_fp = plVar2;
      iVar3 = 1;
      macrodef = iVar3;
      maclcur = plVar2;
    }
  }
  else {
    iVar3 = 0;
    ewprintf("already defining macro");
    macrodef = iVar3;
  }
  return iVar3;
}

Assistant:

int
definemacro(int f, int n)
{
	struct line	*lp1, *lp2;

	macrocount = 0;

	if (macrodef) {
		ewprintf("already defining macro");
		return (macrodef = FALSE);
	}

	/* free lines allocated for string arguments */
	if (maclhead != NULL) {
		for (lp1 = maclhead->l_fp; lp1 != maclhead; lp1 = lp2) {
			lp2 = lp1->l_fp;
			free(lp1);
		}
		free(lp1);
	}

	if ((maclhead = lp1 = lalloc(0)) == NULL)
		return (FALSE);

	ewprintf("Defining Keyboard Macro...");
	maclcur = lp1->l_fp = lp1->l_bp = lp1;
	return (macrodef = TRUE);
}